

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_struct_writer
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool pointers)

{
  t_field *ptVar1;
  bool bVar2;
  int iVar3;
  e_req eVar4;
  int32_t iVar5;
  uint uVar6;
  undefined4 extraout_var;
  members_type *this_00;
  ostream *poVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pptVar8;
  t_type *ptVar9;
  string *psVar10;
  byte local_30d;
  string local_240;
  string local_220;
  string local_200;
  allocator local_1d9;
  string local_1d8;
  allocator local_1b1;
  string local_1b0;
  allocator local_189;
  string local_188;
  allocator local_161;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  byte local_d9;
  const_iterator cStack_d8;
  bool check_if_set;
  t_field **local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_68;
  const_iterator f_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *fields;
  string name;
  bool pointers_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  name.field_2._M_local_buf[0xf] = pointers;
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::__cxx11::string::string((string *)&fields,(string *)CONCAT44(extraout_var,iVar3));
  this_00 = t_struct::get_sorted_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_68);
  if ((this->gen_templates_ & 1U) == 0) {
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::operator<<(poVar7,"uint32_t ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_01,iVar3));
    poVar7 = std::operator<<(poVar7,"::write(::apache::thrift::protocol::TProtocol* oprot) const {")
    ;
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_88,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_88);
    poVar7 = std::operator<<(poVar7,"template <class Protocol_>");
    poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
    poVar7 = std::operator<<(poVar7,(string *)&local_a8);
    poVar7 = std::operator<<(poVar7,"uint32_t ");
    iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::operator<<(poVar7,(string *)CONCAT44(extraout_var_00,iVar3));
    poVar7 = std::operator<<(poVar7,"::write(Protocol_* oprot) const {");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
  }
  t_generator::indent_up((t_generator *)this);
  t_generator::indent_abi_cxx11_(&local_c8,(t_generator *)this);
  poVar7 = std::operator<<(out,(string *)&local_c8);
  poVar7 = std::operator<<(poVar7,"uint32_t xfer = 0;");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_c8);
  poVar7 = t_generator::indent((t_generator *)this,out);
  poVar7 = std::operator<<(poVar7,
                           "::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  poVar7 = t_generator::indent((t_generator *)this,out);
  poVar7 = std::operator<<(poVar7,"xfer += oprot->writeStructBegin(\"");
  poVar7 = std::operator<<(poVar7,(string *)&fields);
  poVar7 = std::operator<<(poVar7,"\");");
  std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
  local_d0 = (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(this_00);
  local_68._M_current = local_d0;
  do {
    cStack_d8 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(this_00);
    bVar2 = __gnu_cxx::operator!=(&local_68,&stack0xffffffffffffff28);
    if (!bVar2) {
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
      poVar7 = std::operator<<(out,(string *)&local_200);
      poVar7 = std::operator<<(poVar7,"xfer += oprot->writeFieldStop();");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_220,(t_generator *)this);
      poVar7 = std::operator<<(poVar7,(string *)&local_220);
      poVar7 = std::operator<<(poVar7,"xfer += oprot->writeStructEnd();");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_240,(t_generator *)this);
      poVar7 = std::operator<<(poVar7,(string *)&local_240);
      poVar7 = std::operator<<(poVar7,"return xfer;");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_240);
      std::__cxx11::string::~string((string *)&local_220);
      std::__cxx11::string::~string((string *)&local_200);
      t_generator::indent_down((t_generator *)this);
      poVar7 = t_generator::indent((t_generator *)this,out);
      poVar7 = std::operator<<(poVar7,"}");
      poVar7 = std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&fields);
      return;
    }
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    eVar4 = t_field::get_req(*pptVar8);
    local_30d = 1;
    if (eVar4 != T_OPTIONAL) {
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar9 = t_field::get_type(*pptVar8);
      iVar3 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])();
      local_30d = (byte)iVar3;
    }
    local_d9 = local_30d & 1;
    if (local_d9 == 0) {
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
    }
    else {
      poVar7 = std::operator<<(out,(string *)&::endl_abi_cxx11_);
      t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
      poVar7 = std::operator<<(poVar7,(string *)&local_100);
      poVar7 = std::operator<<(poVar7,"if (this->__isset.");
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      psVar10 = t_field::get_name_abi_cxx11_(*pptVar8);
      poVar7 = std::operator<<(poVar7,(string *)psVar10);
      poVar7 = std::operator<<(poVar7,") {");
      std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_100);
      t_generator::indent_up((t_generator *)this);
    }
    t_generator::indent_abi_cxx11_(&local_120,(t_generator *)this);
    poVar7 = std::operator<<(out,(string *)&local_120);
    poVar7 = std::operator<<(poVar7,"xfer += oprot->writeFieldBegin(");
    poVar7 = std::operator<<(poVar7,"\"");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    psVar10 = t_field::get_name_abi_cxx11_(*pptVar8);
    poVar7 = std::operator<<(poVar7,(string *)psVar10);
    poVar7 = std::operator<<(poVar7,"\", ");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    ptVar9 = t_field::get_type(*pptVar8);
    type_to_enum_abi_cxx11_(&local_140,this,ptVar9);
    poVar7 = std::operator<<(poVar7,(string *)&local_140);
    poVar7 = std::operator<<(poVar7,", ");
    pptVar8 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_68);
    iVar5 = t_field::get_key(*pptVar8);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7,");");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_120);
    if ((name.field_2._M_local_buf[0xf] & 1U) == 0) {
LAB_002065b1:
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar1 = *pptVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1b0,"this->",&local_1b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1d8,"",&local_1d9);
      generate_serialize_field(this,out,ptVar1,&local_1b0,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    }
    else {
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar9 = t_field::get_type(*pptVar8);
      uVar6 = (*(ptVar9->super_t_doc)._vptr_t_doc[0xc])();
      if ((uVar6 & 1) != 0) goto LAB_002065b1;
      pptVar8 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&local_68);
      ptVar1 = *pptVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_160,"(*(this->",&local_161);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_188,"))",&local_189);
      generate_serialize_field(this,out,ptVar1,&local_160,&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::allocator<char>::~allocator((allocator<char> *)&local_189);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
    poVar7 = t_generator::indent((t_generator *)this,out);
    poVar7 = std::operator<<(poVar7,"xfer += oprot->writeFieldEnd();");
    std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
    if ((local_d9 & 1) != 0) {
      t_generator::indent_down((t_generator *)this);
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::operator<<(poVar7,'}');
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_68);
  } while( true );
}

Assistant:

void t_cpp_generator::generate_struct_writer(ostream& out, t_struct* tstruct, bool pointers) {
  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  if (gen_templates_) {
    out << indent() << "template <class Protocol_>" << endl << indent() << "uint32_t "
        << tstruct->get_name() << "::write(Protocol_* oprot) const {" << endl;
  } else {
    indent(out) << "uint32_t " << tstruct->get_name()
                << "::write(::apache::thrift::protocol::TProtocol* oprot) const {" << endl;
  }
  indent_up();

  out << indent() << "uint32_t xfer = 0;" << endl;

  indent(out) << "::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);" << endl;
  indent(out) << "xfer += oprot->writeStructBegin(\"" << name << "\");" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    bool check_if_set = (*f_iter)->get_req() == t_field::T_OPTIONAL
                        || (*f_iter)->get_type()->is_xception();
    if (check_if_set) {
      out << endl << indent() << "if (this->__isset." << (*f_iter)->get_name() << ") {" << endl;
      indent_up();
    } else {
      out << endl;
    }

    // Write field header
    out << indent() << "xfer += oprot->writeFieldBegin("
        << "\"" << (*f_iter)->get_name() << "\", " << type_to_enum((*f_iter)->get_type()) << ", "
        << (*f_iter)->get_key() << ");" << endl;
    // Write field contents
    if (pointers && !(*f_iter)->get_type()->is_xception()) {
      generate_serialize_field(out, *f_iter, "(*(this->", "))");
    } else {
      generate_serialize_field(out, *f_iter, "this->");
    }
    // Write field closer
    indent(out) << "xfer += oprot->writeFieldEnd();" << endl;
    if (check_if_set) {
      indent_down();
      indent(out) << '}';
    }
  }

  out << endl;

  // Write the struct map
  out << indent() << "xfer += oprot->writeFieldStop();" << endl << indent()
      << "xfer += oprot->writeStructEnd();" << endl << indent()
      << "return xfer;" << endl;

  indent_down();
  indent(out) << "}" << endl << endl;
}